

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

bool ExpressionRunnerSetLocalValue
               (ExpressionRunnerRef runner,BinaryenIndex index,BinaryenExpressionRef value)

{
  undefined1 local_68 [8];
  Flow setFlow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_68,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  if (setFlow.breakTo.super_IString.str._M_len == 0) {
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue
              (&runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>,index,
               (Literals *)local_68);
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &setFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&setFlow);
  return setFlow.breakTo.super_IString.str._M_len == 0;
}

Assistant:

bool ExpressionRunnerSetLocalValue(ExpressionRunnerRef runner,
                                   BinaryenIndex index,
                                   BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setLocalValue(index, setFlow.values);
    return 1;
  }
  return 0;
}